

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Response<capnp::AnyPointer> * __thiscall
kj::_::NullableValue<capnp::Response<capnp::AnyPointer>>::
emplace<capnp::Response<capnp::AnyPointer>>
          (NullableValue<capnp::Response<capnp::AnyPointer>> *this,
          Response<capnp::AnyPointer> *params)

{
  Response<capnp::AnyPointer> *params_00;
  Response<capnp::AnyPointer> *params_local;
  NullableValue<capnp::Response<capnp::AnyPointer>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<capnp::Response<capnp::AnyPointer>>)0x0;
    dtor<capnp::Response<capnp::AnyPointer>>((Response<capnp::AnyPointer> *)(this + 8));
  }
  params_00 = fwd<capnp::Response<capnp::AnyPointer>>(params);
  ctor<capnp::Response<capnp::AnyPointer>,capnp::Response<capnp::AnyPointer>>
            ((Response<capnp::AnyPointer> *)(this + 8),params_00);
  *this = (NullableValue<capnp::Response<capnp::AnyPointer>>)0x1;
  return (Response<capnp::AnyPointer> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }